

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

bool S2::ApproximatelyOrdered(S2Point *a,S2Point *x,S2Point *b,double tolerance)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Vector3_d local_58;
  undefined1 local_38 [16];
  double local_28;
  
  dVar2 = x->c_[1] - a->c_[1];
  dVar3 = x->c_[0] - a->c_[0];
  dVar4 = x->c_[2] - a->c_[2];
  bVar1 = true;
  if ((tolerance * tolerance < dVar4 * dVar4 + dVar2 * dVar2 + dVar3 * dVar3) &&
     (dVar4 = x->c_[1] - b->c_[1], dVar2 = x->c_[0] - b->c_[0], dVar3 = x->c_[2] - b->c_[2],
     tolerance * tolerance < dVar3 * dVar3 + dVar4 * dVar4 + dVar2 * dVar2)) {
    RobustCrossProd(&local_58,a,b);
    dVar2 = SQRT(local_58.c_[1] * local_58.c_[1] + local_58.c_[0] * local_58.c_[0] +
                 local_58.c_[2] * local_58.c_[2]);
    dVar2 = (double)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                    (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
    local_28 = dVar2 * local_58.c_[2];
    local_38._8_4_ = SUB84(dVar2 * local_58.c_[1],0);
    local_38._0_8_ = dVar2 * local_58.c_[0];
    local_38._12_4_ = (int)((ulong)(dVar2 * local_58.c_[1]) >> 0x20);
    bVar1 = s2pred::OrderedCCW(a,x,b,(S2Point *)local_38);
  }
  return bVar1;
}

Assistant:

D operator-(const D& b) const { return D(AsD()) -= b; }